

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QStringList * __thiscall QFileDialog::history(QFileDialog *this)

{
  bool bVar1;
  QFileDialogPrivate *this_00;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QStringList *currentHistory;
  QString newHistory;
  undefined4 in_stack_ffffffffffffff58;
  CaseSensitivity in_stack_ffffffffffffff5c;
  QFileDialogPrivate *this_01;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint uVar2;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QFileDialog *)0x74ef3d);
  bVar1 = QFileDialogPrivate::usingWidgets(in_RDI);
  if (bVar1) {
    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 & 0xffffff;
    *(undefined1 **)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate.field_0x8 =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate.field_0x10 =
         &DAT_aaaaaaaaaaaaaaaa;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&this_00->qFileDialogUi);
    QFileDialogComboBox::history
              ((QFileDialogComboBox *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
    ;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QFileDialogPrivate::rootIndex
              ((QFileDialogPrivate *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    QModelIndex::data((QModelIndex *)this_00,in_stack_ffffffffffffff74);
    ::QVariant::toString();
    QDir::toNativeSeparators((QString *)&local_40);
    QString::~QString((QString *)0x74f02e);
    ::QVariant::~QVariant(&local_28);
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)this_01,(QString *)in_RDI,
                       in_stack_ffffffffffffff5c);
    if (!bVar1) {
      QList<QString>::operator<<
                ((QList<QString> *)in_RDI,
                 (parameter_type)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    uVar2 = 0x1000000;
    QString::~QString((QString *)0x74f071);
    if ((uVar2 & 0x1000000) == 0) {
      QList<QString>::~QList((QList<QString> *)0x74f082);
    }
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x74ef6b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QStringList *)this_01;
}

Assistant:

QStringList QFileDialog::history() const
{
    Q_D(const QFileDialog);
    if (!d->usingWidgets())
        return QStringList();
    QStringList currentHistory = d->qFileDialogUi->lookInCombo->history();
    //On windows the popup display the "C:\", convert to nativeSeparators
    QString newHistory = QDir::toNativeSeparators(d->rootIndex().data(QFileSystemModel::FilePathRole).toString());
    if (!currentHistory.contains(newHistory))
        currentHistory << newHistory;
    return currentHistory;
}